

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_common.c
# Opt level: O3

void av1_set_segdata(segmentation *seg,int segment_id,SEG_LVL_FEATURES feature_id,int seg_data)

{
  undefined7 in_register_00000011;
  
  seg->feature_data[segment_id][CONCAT71(in_register_00000011,feature_id) & 0xffffffff] =
       (int16_t)seg_data;
  return;
}

Assistant:

void av1_set_segdata(struct segmentation *seg, int segment_id,
                     SEG_LVL_FEATURES feature_id, int seg_data) {
  if (seg_data < 0) {
    assert(seg_feature_data_signed[feature_id]);
    assert(-seg_data <= seg_feature_data_max[feature_id]);
  } else {
    assert(seg_data <= seg_feature_data_max[feature_id]);
  }

  seg->feature_data[segment_id][feature_id] = seg_data;
}